

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Opnd *src,BasicBlock *block,Loop *loop,Value *srcVal,bool isNotTypeSpecConv
          ,bool allowNonPrimitives)

{
  bool bVar1;
  OpndKind OVar2;
  HelperCallOpnd *pHVar3;
  RegOpnd *pRVar4;
  SymOpnd *pSVar5;
  PropertySymOpnd *pPVar6;
  StackSym *sym;
  
  bVar1 = Loop::CanHoistInvariants(loop);
  if (bVar1) {
    OVar2 = IR::Opnd::GetKind(src);
    bVar1 = true;
    switch(OVar2) {
    case OpndKindIntConst:
    case OpndKindFloatConst:
    case OpndKindAddr:
      goto switchD_004228a9_caseD_1;
    default:
      goto switchD_004228a9_caseD_2;
    case OpndKindHelperCall:
      pHVar3 = IR::Opnd::AsHelperCallOpnd(src);
      bVar1 = HelperMethodAttributes::IsInVariant(pHVar3->m_fnHelper);
      return bVar1;
    case OpndKindSym:
      pSVar5 = IR::Opnd::AsSymOpnd(src);
      sym = (StackSym *)pSVar5->m_sym;
      pSVar5 = IR::Opnd::AsSymOpnd(src);
      bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
      if (bVar1) {
        pSVar5 = IR::Opnd::AsSymOpnd(src);
        pPVar6 = IR::Opnd::AsPropertySymOpnd(&pSVar5->super_Opnd);
        if (((pPVar6->field_12).field_0.field_5.typeCheckSeqFlags & 8) != 0)
        goto switchD_004228a9_caseD_2;
      }
      break;
    case OpndKindReg:
      pRVar4 = IR::Opnd::AsRegOpnd(src);
      sym = pRVar4->m_sym;
    }
    bVar1 = OptIsInvariant(this,&sym->super_Sym,block,loop,srcVal,isNotTypeSpecConv,
                           allowNonPrimitives,(Value **)0x0);
  }
  else {
switchD_004228a9_caseD_2:
    bVar1 = false;
  }
switchD_004228a9_caseD_1:
  return bVar1;
}

Assistant:

bool
GlobOpt::OptIsInvariant(IR::Opnd *src, BasicBlock *block, Loop *loop, Value *srcVal, bool isNotTypeSpecConv, bool allowNonPrimitives)
{
    if(!loop->CanHoistInvariants())
    {
        return false;
    }

    Sym *sym;

    switch(src->GetKind())
    {
    case IR::OpndKindAddr:
    case IR::OpndKindFloatConst:
    case IR::OpndKindIntConst:
        return true;

    case IR::OpndKindReg:
        sym = src->AsRegOpnd()->m_sym;
        break;

    case IR::OpndKindSym:
        sym = src->AsSymOpnd()->m_sym;
        if (src->AsSymOpnd()->IsPropertySymOpnd())
        {
            if (src->AsSymOpnd()->AsPropertySymOpnd()->IsTypeChecked())
            {
                // We do not handle hoisting these yet.  We might be hoisting this across the instr with the type check protecting this one.
                // And somehow, the dead-store pass now removes the type check on that instr later on...
                // For CheckFixedFld, there is no benefit hoisting these if they don't have a type check as they won't generate code.
                return false;
            }
        }

        break;

    case IR::OpndKindHelperCall:
        // Helper calls, like the private slot getter, can be invariant.
        // Consider moving more math builtin to invariant?
        return HelperMethodAttributes::IsInVariant(src->AsHelperCallOpnd()->m_fnHelper);

    default:
        return false;
    }
    return OptIsInvariant(sym, block, loop, srcVal, isNotTypeSpecConv, allowNonPrimitives);
}